

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O0

int percent_color(int val_cur,int val_max,nh_bool ishp)

{
  int iVar1;
  undefined4 local_18;
  int color;
  nh_bool ishp_local;
  int val_max_local;
  int val_cur_local;
  
  if (val_cur == val_max) {
    local_18 = 7;
  }
  else {
    iVar1 = val_cur * 3;
    if (iVar1 == val_max * 2 || SBORROW4(iVar1,val_max * 2) != iVar1 + val_max * -2 < 0) {
      if (val_max < val_cur * 3) {
        local_18 = 6;
        if (ishp != '\0') {
          local_18 = 3;
        }
      }
      else if (val_max < val_cur * 7) {
        local_18 = 5;
        if (ishp != '\0') {
          local_18 = 9;
        }
      }
      else {
        local_18 = 4;
        if (ishp != '\0') {
          local_18 = 1;
        }
      }
    }
    else {
      local_18 = 2;
    }
  }
  return local_18;
}

Assistant:

static int percent_color(int val_cur, int val_max, nh_bool ishp)
{
    int color;

    if (val_cur == val_max)
	color = CLR_GRAY;
    else if (val_cur * 3 > val_max * 2)
	color = CLR_GREEN;
    else if (val_cur * 3 > val_max * 1)
	color = ishp ? CLR_BROWN : CLR_CYAN;
    else if (val_cur * 7 > val_max * 1)
	color = ishp ? CLR_ORANGE : CLR_MAGENTA;
    else
	color = ishp ? CLR_RED : CLR_BLUE;

    return color;
}